

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O0

void * cab_read_ahead_remaining(archive_read *a,size_t min,ssize_t *avail)

{
  void *pvVar1;
  archive_read *in_RDX;
  long in_RSI;
  void *p;
  size_t in_stack_ffffffffffffffd8;
  long local_18;
  
  local_18 = in_RSI;
  while( true ) {
    if (local_18 == 0) {
      return (void *)0x0;
    }
    pvVar1 = __archive_read_ahead(in_RDX,in_stack_ffffffffffffffd8,(ssize_t *)0x12e79f);
    if (pvVar1 != (void *)0x0) break;
    local_18 = local_18 + -1;
    in_stack_ffffffffffffffd8 = 0;
  }
  return pvVar1;
}

Assistant:

static const void *
cab_read_ahead_remaining(struct archive_read *a, size_t min, ssize_t *avail)
{
	const void *p;

	while (min > 0) {
		p = __archive_read_ahead(a, min, avail);
		if (p != NULL)
			return (p);
		min--;
	}
	return (NULL);
}